

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *scale)

{
  float *in_RSI;
  long in_RDI;
  ImDrawCmd *cmd;
  int cmd_i;
  ImDrawList *cmd_list;
  int i;
  ImVec4 local_40;
  ImDrawCmd *local_30;
  int local_24;
  ImVector<ImDrawCmd> *local_20;
  int local_14;
  float *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x10); local_14 = local_14 + 1) {
    local_20 = *(ImVector<ImDrawCmd> **)(*(long *)(in_RDI + 8) + (long)local_14 * 8);
    for (local_24 = 0; local_24 < local_20->Size; local_24 = local_24 + 1) {
      local_30 = ImVector<ImDrawCmd>::operator[](local_20,local_24);
      ImVec4::ImVec4(&local_40,(local_30->ClipRect).x * *local_10,
                     (local_30->ClipRect).y * local_10[1],(local_30->ClipRect).z * *local_10,
                     (local_30->ClipRect).w * local_10[1]);
      (local_30->ClipRect).x = local_40.x;
      (local_30->ClipRect).y = local_40.y;
      (local_30->ClipRect).z = local_40.z;
      (local_30->ClipRect).w = local_40.w;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * scale.x, cmd->ClipRect.y * scale.y, cmd->ClipRect.z * scale.x, cmd->ClipRect.w * scale.y);
        }
    }
}